

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_DefaultStringAgain_Test::TestBody(TApp_DefaultStringAgain_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_2;
  Message local_140;
  allocator local_131;
  string local_130;
  size_t local_110;
  unsigned_long local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  allocator local_d9;
  string local_d8;
  size_t local_b8;
  unsigned_long local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  undefined1 local_30 [8];
  string str;
  TApp_DefaultStringAgain_Test *this_local;
  
  str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"previous",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"-s,--string",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&(this->super_TApp).app,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_90
            );
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  TApp::run(&this->super_TApp);
  local_b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"-s",&local_d9);
  local_b8 = CLI::App::count(&(this->super_TApp).app,&local_d8);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_a8,"(size_t)0","app.count(\"-s\")",&local_b0,&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_108 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"--string",&local_131);
  local_110 = CLI::App::count(&(this->super_TApp).app,&local_130);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_100,"(size_t)0","app.count(\"--string\")",&local_108,
             &local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[9]>
            ((EqHelper<false> *)local_158,"str","\"previous\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [9])"previous");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TApp, DefaultStringAgain) {
    std::string str = "previous";
    app.add_option("-s,--string", str);
    run();
    EXPECT_EQ((size_t)0, app.count("-s"));
    EXPECT_EQ((size_t)0, app.count("--string"));
    EXPECT_EQ(str, "previous");
}